

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::verifyUniformsReset
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program)

{
  ShaderProgram *pSVar1;
  TestLog *this_00;
  MessageBuilder *this_01;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  MessageBuilder local_198;
  ShaderProgram *local_18;
  ShaderProgram *program_local;
  ProgramBinaryUniformResetCase *this_local;
  
  local_18 = program;
  program_local = (ShaderProgram *)this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_198,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      (&local_198,(char (*) [36])"Verifying uniform reset to 0/false.");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  pSVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"u_boolVar",&local_1c9);
  verifyUniformInt(this,pSVar1,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  pSVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"u_intVar",&local_1f1);
  verifyUniformInt(this,pSVar1,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  pSVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"u_floatVar",&local_219);
  verifyUniformFloat(this,pSVar1,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  return;
}

Assistant:

void verifyUniformsReset (glu::ShaderProgram& program)
	{
		m_testCtx.getLog() << TestLog::Message << "Verifying uniform reset to 0/false." << TestLog::EndMessage;

		verifyUniformInt	(program,	"u_boolVar");
		verifyUniformInt	(program,	"u_intVar");
		verifyUniformFloat	(program,	"u_floatVar");
	}